

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReaderCache::purgeAll(PtexReaderCache *this)

{
  size_t *psVar1;
  size_t sVar2;
  ulong uVar3;
  Purger purger;
  Purger local_18;
  
  local_18.memUsedChangeTotal = 0;
  PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::
  foreach<Ptex::v2_2::PtexReaderCache::Purger>(&this->_files,&local_18);
  if (local_18.memUsedChangeTotal != 0) {
    LOCK();
    psVar1 = &this->_memUsed;
    sVar2 = *psVar1;
    *psVar1 = *psVar1 + local_18.memUsedChangeTotal;
    UNLOCK();
    uVar3 = sVar2 + local_18.memUsedChangeTotal;
    if (sVar2 + local_18.memUsedChangeTotal < this->_peakMemUsed) {
      uVar3 = this->_peakMemUsed;
    }
    this->_peakMemUsed = uVar3;
  }
  return;
}

Assistant:

void PtexReaderCache::purgeAll()
{
    Purger purger;
    _files.foreach(purger);
    adjustMemUsed(purger.memUsedChangeTotal);
}